

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_toUnicode_63(UConverter *cnv,UChar **target,UChar *targetLimit,char **source,
                      char *sourceLimit,int32_t *offsets,UBool flush,UErrorCode *err)

{
  UConverter *pUVar1;
  char **ppcVar2;
  UBool UVar3;
  UChar *local_88;
  UChar *t;
  char *s;
  UConverterToUnicodeArgs args;
  int32_t *offsets_local;
  char *sourceLimit_local;
  char **source_local;
  UChar *targetLimit_local;
  UChar **target_local;
  UConverter *cnv_local;
  
  if ((err != (UErrorCode *)0x0) && (args.offsets = offsets, UVar3 = U_FAILURE(*err), UVar3 == '\0')
     ) {
    if ((cnv == (UConverter *)0x0) || ((target == (UChar **)0x0 || (source == (char **)0x0)))) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      pUVar1 = (UConverter *)*source;
      ppcVar2 = (char **)*target;
      if (targetLimit < (UChar *)((long)targetLimit + 0x7fffffffU)) {
        local_88 = (UChar *)((long)targetLimit + 0x7fffffff);
      }
      else {
        local_88 = (UChar *)0xffffffffffffffff;
      }
      source_local = (char **)targetLimit;
      if (local_88 == targetLimit) {
        source_local = (char **)((long)targetLimit + -1);
      }
      if ((((sourceLimit < pUVar1) || (source_local < ppcVar2)) ||
          ((0x7fffffff < (ulong)((long)sourceLimit - (long)pUVar1) && (pUVar1 < sourceLimit)))) ||
         (((0x3fffffff < (ulong)((long)source_local - (long)ppcVar2 >> 1) &&
           (ppcVar2 < source_local)) || (((long)source_local - (long)ppcVar2 & 1U) != 0)))) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else if (((cnv->UCharErrorBufferLength < '\x01') ||
               (UVar3 = ucnv_outputOverflowToUnicode
                                  (cnv,target,(UChar *)source_local,&args.offsets,err),
               UVar3 == '\0')) &&
              ((flush != '\0' ||
               ((pUVar1 != (UConverter *)sourceLimit || (cnv->preToULength < '\0')))))) {
        s._2_1_ = flush;
        args.targetLimit = (UChar *)args.offsets;
        args.sourceLimit = (char *)*target;
        args.target = (UChar *)source_local;
        s._0_2_ = 0x38;
        args._0_8_ = cnv;
        args.converter = pUVar1;
        args.source = sourceLimit;
        _toUnicodeWithCallback((UConverterToUnicodeArgs *)&s,err);
        *source = (char *)args.converter;
        *target = (UChar *)args.sourceLimit;
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_toUnicode(UConverter *cnv,
               UChar **target, const UChar *targetLimit,
               const char **source, const char *sourceLimit,
               int32_t *offsets,
               UBool flush,
               UErrorCode *err) {
    UConverterToUnicodeArgs args;
    const char *s;
    UChar *t;

    /* check parameters */
    if(err==NULL || U_FAILURE(*err)) {
        return;
    }

    if(cnv==NULL || target==NULL || source==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    s=*source;
    t=*target;

    if ((const void *)U_MAX_PTR(targetLimit) == (const void *)targetLimit) {
        /*
        Prevent code from going into an infinite loop in case we do hit this
        limit. The limit pointer is expected to be on a UChar * boundary.
        This also prevents the next argument check from failing.
        */
        targetLimit = (const UChar *)(((const char *)targetLimit) - 1);
    }

    /*
     * All these conditions should never happen.
     *
     * 1) Make sure that the limits are >= to the address source or target
     *
     * 2) Make sure that the buffer sizes do not exceed the number range for
     * int32_t because some functions use the size (in units or bytes)
     * rather than comparing pointers, and because offsets are int32_t values.
     *
     * size_t is guaranteed to be unsigned and large enough for the job.
     *
     * Return with an error instead of adjusting the limits because we would
     * not be able to maintain the semantics that either the source must be
     * consumed or the target filled (unless an error occurs).
     * An adjustment would be sourceLimit=t+0x7fffffff; for example.
     *
     * 3) Make sure that the user didn't incorrectly cast a UChar * pointer
     * to a char * pointer and provide an incomplete UChar code unit.
     */
    if (sourceLimit<s || targetLimit<t ||
        ((size_t)(sourceLimit-s)>(size_t)0x7fffffff && sourceLimit>s) ||
        ((size_t)(targetLimit-t)>(size_t)0x3fffffff && targetLimit>t) ||
        (((const char *)targetLimit-(const char *)t) & 1) != 0
    ) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    
    /* output the target overflow buffer */
    if( cnv->UCharErrorBufferLength>0 &&
        ucnv_outputOverflowToUnicode(cnv, target, targetLimit, &offsets, err)
    ) {
        /* U_BUFFER_OVERFLOW_ERROR */
        return;
    }
    /* *target may have moved, therefore stop using t */

    if(!flush && s==sourceLimit && cnv->preToULength>=0) {
        /* the overflow buffer is emptied and there is no new input: we are done */
        return;
    }

    /*
     * Do not simply return with a buffer overflow error if
     * !flush && t==targetLimit
     * because it is possible that the source will not generate any output.
     * For example, the skip callback may be called;
     * it does not output anything.
     */

    /* prepare the converter arguments */
    args.converter=cnv;
    args.flush=flush;
    args.offsets=offsets;
    args.source=s;
    args.sourceLimit=sourceLimit;
    args.target=*target;
    args.targetLimit=targetLimit;
    args.size=sizeof(args);

    _toUnicodeWithCallback(&args, err);

    *source=args.source;
    *target=args.target;
}